

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMask.cpp
# Opt level: O1

void __thiscall chrono::ChLinkMask::~ChLinkMask(ChLinkMask *this)

{
  ChConstraintTwoBodies *pCVar1;
  pointer ppCVar2;
  long lVar3;
  
  this->_vptr_ChLinkMask = (_func_int **)&PTR__ChLinkMask_00b3d820;
  if (0 < this->nconstr) {
    lVar3 = 0;
    do {
      pCVar1 = (this->constraints).
               super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar3];
      if (pCVar1 != (ChConstraintTwoBodies *)0x0) {
        (**(code **)((long)(pCVar1->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint + 8
                    ))();
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < this->nconstr);
  }
  ppCVar2 = (this->constraints).
            super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppCVar2 != (pointer)0x0) {
    operator_delete(ppCVar2,(long)(this->constraints).
                                  super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppCVar2
                   );
    return;
  }
  return;
}

Assistant:

ChLinkMask::~ChLinkMask() {
    for (int i = 0; i < nconstr; i++) {
        if (constraints[i]) {
            delete constraints[i];
        }
    }
}